

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Array __thiscall pbrt::ScratchBuffer::Alloc<pbrt::Vertex[]>(ScratchBuffer *this,size_t n)

{
  Array pVVar1;
  Array this_00;
  bool bVar2;
  
  pVVar1 = (Array)Alloc(this,n * 0x160,8);
  this_00 = pVVar1;
  while (bVar2 = n != 0, n = n - 1, bVar2) {
    Vertex::Vertex(this_00);
    this_00 = this_00 + 1;
  }
  return pVVar1;
}

Assistant:

PBRT_CPU_GPU typename AllocationTraits<T>::Array Alloc(size_t n = 1) {
        using ElementType = typename std::remove_extent<T>::type;
        ElementType *ret =
            (ElementType *)Alloc(n * sizeof(ElementType), alignof(ElementType));
        for (size_t i = 0; i < n; ++i)
            new (&ret[i]) ElementType();
        return ret;
    }